

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O2

void __thiscall sfm::FeatureSet::compute_features(FeatureSet *this,Ptr *image)

{
  pointer pVVar1;
  pointer pVVar2;
  element_type *peVar3;
  FeatureTypes FVar4;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pVVar1 = (this->colors).
           super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colors).
      super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->colors).
    super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->positions).
           super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->positions).
      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar2) {
    (this->positions).
    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  peVar3 = (image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this->width = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  this->height = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
  FVar4 = (this->opts).feature_types;
  if ((FVar4 & FEATURE_SIFT) != 0) {
    std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<unsigned_char>,void>
              (local_48,&image->
                         super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
    ;
    compute_sift(this,(ConstPtr *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    FVar4 = (this->opts).feature_types;
  }
  if ((FVar4 & FEATURE_SURF) != 0) {
    std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<unsigned_char>,void>
              (local_38,&image->
                         super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
    ;
    compute_surf(this,(ConstPtr *)local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  return;
}

Assistant:

void
FeatureSet::compute_features (core::ByteImage::Ptr image)
{
    this->colors.clear();
    this->positions.clear();
    this->width = image->width();
    this->height = image->height();

    /* Make sure these are in the right order. Matching relies on it. */
    if (this->opts.feature_types & FEATURE_SIFT)
        this->compute_sift(image);
    if (this->opts.feature_types & FEATURE_SURF)
        this->compute_surf(image);
}